

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall Json::FastWriter::~FastWriter(FastWriter *this)

{
  Writer *in_RDI;
  
  in_RDI->_vptr_Writer = (_func_int **)&PTR__FastWriter_00148d08;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  Writer::~Writer(in_RDI);
  return;
}

Assistant:

virtual ~FastWriter() {}